

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackCheck.cpp
# Opt level: O0

Expression * __thiscall
wasm::EnforceStackLimits::stackBoundsCheck
          (EnforceStackLimits *this,Function *func,Expression *value)

{
  Builder *pBVar1;
  Builder *this_00;
  Builder *pBVar2;
  Global *pGVar3;
  initializer_list<wasm::Expression_*> __l;
  Name target;
  string_view name;
  Call *ifTrue;
  bool bVar4;
  BinaryOp BVar5;
  LocalSet *left;
  GlobalGet *pGVar6;
  Binary *pBVar7;
  LocalGet *pLVar8;
  Binary *right;
  GlobalSet *append;
  Block *pBVar9;
  optional<wasm::Type> type;
  GlobalSet *newSet;
  optional<wasm::Type> local_108;
  uintptr_t local_f8;
  size_t local_f0;
  char *local_e8;
  uintptr_t local_e0;
  uintptr_t local_d8;
  uintptr_t local_d0;
  size_t local_c8;
  char *local_c0;
  uintptr_t local_b8;
  uintptr_t local_b0;
  If *local_a8;
  If *check;
  allocator<wasm::Expression_*> local_81;
  uintptr_t local_80;
  LocalGet *local_78;
  LocalGet **local_70;
  size_type local_68;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_60;
  size_t local_48;
  char *pcStack_40;
  Call *local_38;
  Expression *handlerExpr;
  Index local_24;
  Expression *pEStack_20;
  Index newSP;
  Expression *value_local;
  Function *func_local;
  EnforceStackLimits *this_local;
  
  handlerExpr = (Expression *)(this->stackPointer->type).id;
  pEStack_20 = value;
  value_local = (Expression *)func;
  func_local = (Function *)this;
  local_24 = Builder::addVar(func,(Type)handlerExpr);
  bVar4 = IString::is(&(this->handler).super_IString);
  if (bVar4) {
    pBVar1 = this->builder;
    local_48 = (this->handler).super_IString.str._M_len;
    pcStack_40 = (this->handler).super_IString.str._M_str;
    local_80 = (this->stackPointer->type).id;
    local_78 = Builder::makeLocalGet(this->builder,local_24,(Type)local_80);
    local_70 = &local_78;
    local_68 = 1;
    std::allocator<wasm::Expression_*>::allocator(&local_81);
    __l._M_len = local_68;
    __l._M_array = (iterator)local_70;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              (&local_60,__l,&local_81);
    check = (If *)(this->stackPointer->type).id;
    target.super_IString.str._M_str = pcStack_40;
    target.super_IString.str._M_len = local_48;
    local_38 = Builder::makeCall(pBVar1,target,&local_60,(Type)check,false);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_60);
    std::allocator<wasm::Expression_*>::~allocator(&local_81);
  }
  else {
    local_38 = (Call *)Builder::makeUnreachable(this->builder);
  }
  pBVar1 = this->builder;
  this_00 = this->builder;
  pBVar2 = this->builder;
  local_b0 = (this->stackPointer->type).id;
  BVar5 = Abstract::getBinary((Type)local_b0,GtU);
  local_b8 = (this->stackPointer->type).id;
  left = Builder::makeLocalTee(this->builder,local_24,pEStack_20,(Type)local_b8);
  pGVar3 = this->stackBase;
  local_c8 = (pGVar3->super_Importable).super_Named.name.super_IString.str._M_len;
  local_c0 = (pGVar3->super_Importable).super_Named.name.super_IString.str._M_str;
  local_d0 = (this->stackBase->type).id;
  pGVar6 = Builder::makeGlobalGet
                     (this->builder,
                      (Name)(pGVar3->super_Importable).super_Named.name.super_IString.str,
                      (Type)local_d0);
  pBVar7 = Builder::makeBinary(pBVar2,BVar5,(Expression *)left,(Expression *)pGVar6);
  pBVar2 = this->builder;
  local_d8 = (this->stackPointer->type).id;
  BVar5 = Abstract::getBinary((Type)local_d8,LtU);
  local_e0 = (this->stackPointer->type).id;
  pLVar8 = Builder::makeLocalGet(this->builder,local_24,(Type)local_e0);
  pGVar3 = this->stackLimit;
  local_f0 = (pGVar3->super_Importable).super_Named.name.super_IString.str._M_len;
  local_e8 = (pGVar3->super_Importable).super_Named.name.super_IString.str._M_str;
  local_f8 = (this->stackLimit->type).id;
  pGVar6 = Builder::makeGlobalGet
                     (this->builder,
                      (Name)(pGVar3->super_Importable).super_Named.name.super_IString.str,
                      (Type)local_f8);
  right = Builder::makeBinary(pBVar2,BVar5,(Expression *)pLVar8,(Expression *)pGVar6);
  pBVar7 = Builder::makeBinary(this_00,OrInt32,(Expression *)pBVar7,(Expression *)right);
  ifTrue = local_38;
  std::optional<wasm::Type>::optional(&local_108);
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_7_ = 0;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload =
       local_108.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_payload;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged =
       local_108.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_engaged;
  local_a8 = Builder::makeIf(pBVar1,(Expression *)pBVar7,(Expression *)ifTrue,(Expression *)0x0,type
                            );
  pBVar1 = this->builder;
  name = (this->stackPointer->super_Importable).super_Named.name.super_IString.str;
  pLVar8 = Builder::makeLocalGet(this->builder,local_24,(Type)(this->stackPointer->type).id);
  append = Builder::makeGlobalSet(pBVar1,(Name)name,(Expression *)pLVar8);
  pBVar9 = Builder::blockify(this->builder,(Expression *)local_a8,(Expression *)append);
  return (Expression *)pBVar9;
}

Assistant:

Expression* stackBoundsCheck(Function* func, Expression* value) {
    // Add a local to store the value of the expression. We need the value
    // twice: once to check if it has overflowed, and again to assign to store
    // it.
    auto newSP = Builder::addVar(func, stackPointer->type);
    // If we imported a handler, call it. That can show a nice error in JS.
    // Otherwise, just trap.
    Expression* handlerExpr;
    if (handler.is()) {
      handlerExpr =
        builder.makeCall(handler,
                         {builder.makeLocalGet(newSP, stackPointer->type)},
                         stackPointer->type);
    } else {
      handlerExpr = builder.makeUnreachable();
    }

    // If it is >= the base or <= the limit, then error.
    auto check = builder.makeIf(
      builder.makeBinary(
        BinaryOp::OrInt32,
        builder.makeBinary(
          Abstract::getBinary(stackPointer->type, Abstract::GtU),
          builder.makeLocalTee(newSP, value, stackPointer->type),
          builder.makeGlobalGet(stackBase->name, stackBase->type)),
        builder.makeBinary(
          Abstract::getBinary(stackPointer->type, Abstract::LtU),
          builder.makeLocalGet(newSP, stackPointer->type),
          builder.makeGlobalGet(stackLimit->name, stackLimit->type))),
      handlerExpr);
    // (global.set $__stack_pointer (local.get $newSP))
    auto newSet = builder.makeGlobalSet(
      stackPointer->name, builder.makeLocalGet(newSP, stackPointer->type));
    return builder.blockify(check, newSet);
  }